

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Hpipe::Vec<std::__cxx11::string>::push_back_unique<std::__cxx11::string>
          (Vec<std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  long lVar1;
  long lVar2;
  pointer __s2;
  size_t __n;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  
  lVar1 = *(long *)this;
  lVar2 = *(long *)(this + 8);
  if (lVar2 - lVar1 != 0) {
    __s2 = (val->_M_dataplus)._M_p;
    __n = val->_M_string_length;
    uVar4 = 1;
    uVar5 = 0;
    do {
      if (*(size_t *)(lVar1 + 8 + uVar5 * 0x20) == __n) {
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (uVar5 * 0x20 + lVar1);
        if (__n == 0) {
          return pbVar6;
        }
        iVar3 = bcmp((pbVar6->_M_dataplus)._M_p,__s2,__n);
        if (iVar3 == 0) {
          return pbVar6;
        }
      }
      uVar5 = (ulong)uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar5 < (ulong)(lVar2 - lVar1 >> 5));
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,val);
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (*(long *)(this + 8) + -0x20);
}

Assistant:

T       *push_back_unique     ( Arg &&val ) { for( unsigned i = 0; i < this->size(); ++i ) if ( this->operator[]( i ) == val ) return &this->operator[]( i ); return push_back( std::forward<Arg>( val ) ); }